

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O2

void __thiscall PartsBupOutputter::writeJSON(PartsBupOutputter *this)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  *ppVar1;
  pointer pIVar2;
  pointer ppVar3;
  ostream *poVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  *item;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  ImageEntry *img;
  pointer item_00;
  pointer item_01;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  *exp;
  anon_class_8_1_ba1d6aae lastComma;
  path name;
  ofstream out;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lastComma,
                 &this->baseName,".json");
  std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
            ((path *)&out,(__cxx11 *)&lastComma,__source);
  std::filesystem::__cxx11::operator/(&name,&this->basePath,(path *)&out);
  std::filesystem::__cxx11::path::~path((path *)&out);
  std::__cxx11::string::~string((string *)&lastComma);
  std::ofstream::ofstream((ostream *)&out,name._M_pathname._M_dataplus._M_p,_S_bin);
  lastComma.out = &out;
  poVar4 = std::operator<<((ostream *)&out,"{");
  std::endl<char,std::char_traits<char>>(poVar4);
  ppVar1 = (this->expressions).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (item = (this->expressions).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; item != ppVar1; item = item + 1) {
    poVar4 = std::operator<<((ostream *)&out,"\t\"");
    poVar4 = std::operator<<(poVar4,(string *)item);
    poVar4 = std::operator<<(poVar4,"\": [");
    std::endl<char,std::char_traits<char>>(poVar4);
    pIVar2 = (item->second).
             super__Vector_base<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (item_00 = (item->second).
                   super__Vector_base<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start; item_00 != pIVar2;
        item_00 = item_00 + 1) {
      poVar4 = std::operator<<((ostream *)&out,"\t\t{");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::operator<<((ostream *)&out,"\t\t\t\"blend\": \"");
      if ((ulong)item_00->color < 3) {
        std::operator<<((ostream *)&out,
                        &DAT_00113924 + *(int *)(&DAT_00113924 + (ulong)item_00->color * 4));
      }
      poVar4 = std::operator<<((ostream *)&out,"\",");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)&out,"\t\t\t\"parts\": [");
      std::endl<char,std::char_traits<char>>(poVar4);
      ppVar3 = (item_00->parts).
               super__Vector_base<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (item_01 = (item_00->parts).
                     super__Vector_base<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; item_01 != ppVar3;
          item_01 = item_01 + 1) {
        std::operator<<((ostream *)&out,"\t\t\t\t{\"path\": \"");
        std::operator<<((ostream *)&out,(string *)&item_01->second);
        std::operator<<((ostream *)&out,"\", \"x\": ");
        std::ostream::operator<<((ostream *)&out,(item_01->first).x);
        std::operator<<((ostream *)&out,", \"y\": ");
        std::ostream::operator<<((ostream *)&out,(item_01->first).y);
        std::operator<<((ostream *)&out,"}");
        writeJSON()::{lambda(auto:1_const&,auto:2_const&)#1}::operator()
                  (&lastComma,item_01,&item_00->parts);
      }
      poVar4 = std::operator<<((ostream *)&out,"\t\t\t]");
      std::endl<char,std::char_traits<char>>(poVar4);
      std::operator<<((ostream *)&out,"\t\t}");
      writeJSON()::{lambda(auto:1_const&,auto:2_const&)#1}::operator()
                (&lastComma,item_00,&item->second);
    }
    std::operator<<((ostream *)&out,"\t]");
    writeJSON()::{lambda(auto:1_const&,auto:2_const&)#1}::operator()
              (&lastComma,item,&this->expressions);
  }
  poVar4 = std::operator<<((ostream *)&out,"}");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ofstream::~ofstream(&out);
  std::filesystem::__cxx11::path::~path(&name);
  return;
}

Assistant:

void writeJSON() {
		fs::path name = basePath/fs::u8path(baseName + ".json");
		// When you didn't bother to import a json library
		// Hopefully no one puts weird characters in their expression names
#ifdef USE_BOOST_FS
		fs::ofstream out(name, std::ios::binary);
#else
		std::ofstream out(name, std::ios::binary);
#endif

		auto lastComma = [&](const auto& item, const auto& arr){
			if (&item != &arr.back()) {
				out << ",";
			}
			out << std::endl;
		};

		out << "{" << std::endl;
		for (const auto& exp : expressions) {
			out << "\t\"" << exp.first << "\": [" << std::endl;
			for (const auto& img : exp.second) {
				out << "\t\t{" << std::endl;
				out << "\t\t\t\"blend\": \"";
				switch (img.color) {
#define OUT(x) case Blend::x: out << #x; break;
						OUT(AlphaBlend)
						OUT(CustomBlend)
						OUT(NotPossible)
#undef OUT
				}
				out << "\"," << std::endl;
				out << "\t\t\t\"parts\": [" << std::endl;
				for (const auto& part : img.parts) {
					out << "\t\t\t\t{\"path\": \"";
					out << part.second;
					out << "\", \"x\": ";
					out << part.first.x;
					out << ", \"y\": ";
					out << part.first.y;
					out << "}";
					lastComma(part, img.parts);
				}
				out << "\t\t\t]" << std::endl;
				out << "\t\t}";
				lastComma(img, exp.second);
			}
			out << "\t]";
			lastComma(exp, expressions);
		}
		out << "}" << std::endl;
	}